

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O3

void __thiscall leveldb::Benchmark::HeapProfile(Benchmark *this)

{
  FilterPolicy **__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  long *plVar3;
  size_t sVar4;
  Status s;
  WritableFile *file;
  char fname [100];
  Status local_c0;
  string local_b8;
  void *local_98;
  Benchmark local_90 [2];
  
  pcVar2 = FLAGS_db;
  this->heap_counter_ = this->heap_counter_ + 1;
  __s = &local_90[0].filter_policy_;
  snprintf((char *)__s,100,"%s/heap-%04d",pcVar2);
  plVar3 = (anonymous_namespace)::g_env;
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  sVar4 = strlen((char *)__s);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,__s,(long)&local_90[0].filter_policy_ + sVar4);
  (**(code **)(*plVar3 + 0x20))(&local_c0,plVar3,&local_b8,local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_c0.state_ == (char *)0x0) {
    HeapProfile(local_90);
    fwrite("heap profiling not supported\n",0x1d,1,_stderr);
    plVar3 = (anonymous_namespace)::g_env;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = strlen((char *)&local_90[0].filter_policy_);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,&local_90[0].filter_policy_,
               (long)&local_90[0].filter_policy_ + sVar4);
    (**(code **)(*plVar3 + 0x40))(&local_98,plVar3,&local_b8);
    if (local_98 != (void *)0x0) {
      operator_delete__(local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  else {
    Status::ToString_abi_cxx11_(&local_b8,&local_c0);
    HeapProfile();
  }
  if (local_c0.state_ != (char *)0x0) {
    operator_delete__(local_c0.state_);
  }
  return;
}

Assistant:

void HeapProfile() {
    char fname[100];
    snprintf(fname, sizeof(fname), "%s/heap-%04d", FLAGS_db, ++heap_counter_);
    WritableFile* file;
    Status s = g_env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      fprintf(stderr, "%s\n", s.ToString().c_str());
      return;
    }
    bool ok = port::GetHeapProfile(WriteToFile, file);
    delete file;
    if (!ok) {
      fprintf(stderr, "heap profiling not supported\n");
      g_env->DeleteFile(fname);
    }
  }